

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O3

Status __thiscall
leveldb::Table::InternalGet
          (Table *this,ReadOptions *options,Slice *k,void *arg,
          _func_void_void_ptr_Slice_ptr_Slice_ptr *handle_result)

{
  FilterBlockReader *this_00;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Iterator *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Iterator *pIVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  code *in_R9;
  long in_FS_OFFSET;
  BlockHandle handle;
  Slice handle_value;
  undefined8 local_78 [2];
  Slice local_68;
  Slice local_58;
  Table local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->rep_ = (Rep *)0x0;
  pIVar4 = Block::NewIterator((Block *)(*(undefined8 **)options)[0x13],
                              (Comparator *)**(undefined8 **)options);
  (*pIVar4->_vptr_Iterator[5])(pIVar4,arg);
  iVar3 = (*pIVar4->_vptr_Iterator[2])(pIVar4);
  if ((char)iVar3 != '\0') {
    iVar3 = (*pIVar4->_vptr_Iterator[9])(pIVar4);
    local_48[0].rep_ = (Rep *)CONCAT44(extraout_var,iVar3);
    this_00 = *(FilterBlockReader **)(*(long *)options + 0x78);
    local_58.data_._0_4_ = 0xffffffff;
    local_58.data_._4_4_ = 0xffffffff;
    local_58.size_._0_4_ = 0xffffffff;
    local_58.size_._4_4_ = 0xffffffff;
    if (this_00 != (FilterBlockReader *)0x0) {
      BlockHandle::DecodeFrom((BlockHandle *)&local_68,&local_58);
      if ((Rep *)local_68.data_ == (Rep *)0x0) {
        bVar2 = FilterBlockReader::KeyMayMatch
                          (this_00,CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_),(Slice *)arg)
        ;
        if ((Rep *)local_68.data_ != (Rep *)0x0) {
          operator_delete__(local_68.data_);
        }
        if (!bVar2) goto LAB_006736bf;
      }
      else {
        operator_delete__(local_68.data_);
      }
    }
    iVar3 = (*pIVar4->_vptr_Iterator[9])(pIVar4);
    local_68.data_ = (char *)CONCAT44(extraout_var_00,iVar3);
    pIVar5 = BlockReader(options,(ReadOptions *)k,&local_68);
    (*pIVar5->_vptr_Iterator[5])(pIVar5,arg);
    iVar3 = (*pIVar5->_vptr_Iterator[2])(pIVar5);
    if ((char)iVar3 != '\0') {
      iVar3 = (*pIVar5->_vptr_Iterator[8])(pIVar5);
      local_68.data_ = (char *)CONCAT44(extraout_var_01,iVar3);
      iVar3 = (*pIVar5->_vptr_Iterator[9])(pIVar5);
      local_78[0] = CONCAT44(extraout_var_02,iVar3);
      (*in_R9)(handle_result,&local_68,local_78);
    }
    (*pIVar5->_vptr_Iterator[10])(&local_68,pIVar5);
    pcVar1 = local_68.data_;
    this->rep_ = (Rep *)local_68.data_;
    (*pIVar5->_vptr_Iterator[1])(pIVar5);
    if ((Rep *)pcVar1 != (Rep *)0x0) goto LAB_006736d6;
  }
LAB_006736bf:
  (*pIVar4->_vptr_Iterator[10])(local_48,pIVar4);
  this->rep_ = (Rep *)local_48[0];
LAB_006736d6:
  (*pIVar4->_vptr_Iterator[1])(pIVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Table::InternalGet(const ReadOptions& options, const Slice& k, void* arg,
                          void (*handle_result)(void*, const Slice&,
                                                const Slice&)) {
  Status s;
  Iterator* iiter = rep_->index_block->NewIterator(rep_->options.comparator);
  iiter->Seek(k);
  if (iiter->Valid()) {
    Slice handle_value = iiter->value();
    FilterBlockReader* filter = rep_->filter;
    BlockHandle handle;
    if (filter != nullptr && handle.DecodeFrom(&handle_value).ok() &&
        !filter->KeyMayMatch(handle.offset(), k)) {
      // Not found
    } else {
      Iterator* block_iter = BlockReader(this, options, iiter->value());
      block_iter->Seek(k);
      if (block_iter->Valid()) {
        (*handle_result)(arg, block_iter->key(), block_iter->value());
      }
      s = block_iter->status();
      delete block_iter;
    }
  }
  if (s.ok()) {
    s = iiter->status();
  }
  delete iiter;
  return s;
}